

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rbuUnlockShm(rbu_file *p)

{
  _func_int_sqlite3_file_ptr_int_int_int *p_Var1;
  uint uVar2;
  
  if (p->pRbu != (sqlite3rbu *)0x0) {
    p_Var1 = p->pReal->pMethods->xShmLock;
    uVar2 = 0;
    do {
      if ((p->pRbu->mLock >> (uVar2 & 0x1f) & 1) != 0) {
        (*p_Var1)(p->pReal,uVar2,1,9);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 8);
    p->pRbu->mLock = 0;
  }
  return;
}

Assistant:

static void rbuUnlockShm(rbu_file *p){
  assert( p->openFlags & SQLITE_OPEN_MAIN_DB );
  if( p->pRbu ){
    int (*xShmLock)(sqlite3_file*,int,int,int) = p->pReal->pMethods->xShmLock;
    int i;
    for(i=0; i<SQLITE_SHM_NLOCK;i++){
      if( (1<<i) & p->pRbu->mLock ){
        xShmLock(p->pReal, i, 1, SQLITE_SHM_UNLOCK|SQLITE_SHM_EXCLUSIVE);
      }
    }
    p->pRbu->mLock = 0;
  }
}